

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall r_code::SysView::~SysView(SysView *this)

{
  ImageObject::~ImageObject(&this->super_ImageObject);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT SysView : public ImageObject
{
public:
    SysView();
    SysView(View *source);

    void write(uint32_t *data);
    void read(uint32_t *data);
    size_t get_size() const;
    void trace();
}